

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O0

FIOBJ fiobj_hash_remove2(FIOBJ hash,uint64_t hash_value)

{
  size_t sVar1;
  FIOBJ local_20;
  FIOBJ old;
  uint64_t hash_value_local;
  FIOBJ hash_local;
  
  old = hash_value;
  hash_value_local = hash;
  if (hash != 0) {
    sVar1 = fiobj_type_is(hash,FIOBJ_T_HASH);
    if (sVar1 != 0) {
      local_20 = 0;
      fio_hash___remove((fio_hash___s *)((hash_value_local & 0xfffffffffffffff8) + 8),old,
                        0xffffffffffffffff,&local_20);
      return local_20;
    }
  }
  __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                ,0x106,"FIOBJ fiobj_hash_remove2(FIOBJ, uint64_t)");
}

Assistant:

FIOBJ fiobj_hash_remove2(FIOBJ hash, uint64_t hash_value) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  FIOBJ old = FIOBJ_INVALID;
  fio_hash___remove(&obj2hash(hash)->hash, hash_value, -1, &old);
  return old;
}